

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O2

void __thiscall LinkedReadsDatastore::print_status(LinkedReadsDatastore *this)

{
  pointer puVar1;
  ostream *poVar2;
  
  for (puVar1 = (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar1 != (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish; puVar1 = puVar1 + 1) {
  }
  poVar2 = sdglib::OutputLog(INFO,true);
  poVar2 = std::operator<<(poVar2,"LinkedRead Datastore from ");
  poVar2 = std::operator<<(poVar2,(string *)this);
  poVar2 = std::operator<<(poVar2," contains ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," reads, with a maximum size of ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," in ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," tags.");
  std::endl<char,std::char_traits<char>>(poVar2);
  LinkedReadsMapper::print_status(&this->mapper);
  return;
}

Assistant:

void LinkedReadsDatastore::print_status() const {
    uint64_t tagcount=0;
    LinkedTag prevtag=0;
    for (auto t:read_tag) {
        if (t != prevtag) {
            ++tagcount;
            t = prevtag;
        }
    }
    sdglib::OutputLog()<<"LinkedRead Datastore from "<<filename<<" contains "<<size()-1<<" reads, with a maximum size of " << readsize << " in "<< tagcount <<" tags."<<std::endl;
    mapper.print_status();
}